

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::BaseBuilder::registerLabelNode(BaseBuilder *this,LabelNode *node)

{
  uint uVar1;
  Error EVar2;
  Error EVar3;
  Error extraout_EAX;
  LabelEntry *pLVar4;
  uint n;
  uint8_t extraout_DL;
  BaseBuilder *allocator;
  CodeHolder *this_00;
  ZoneVector<asmjit::v1_14::LabelNode_*> *unaff_R15;
  LabelEntry *le;
  size_t sStack_60;
  LabelNode *pLStack_58;
  BaseBuilder *pBStack_50;
  ZoneVector<asmjit::v1_14::LabelNode_*> *pZStack_48;
  code *pcStack_40;
  _func_int **local_30;
  
  this_00 = (this->super_BaseEmitter)._code;
  if (this_00 == (CodeHolder *)0x0) {
    return 5;
  }
  allocator = (BaseBuilder *)&stack0xffffffffffffffd0;
  pcStack_40 = (code *)0x1168ed;
  EVar2 = CodeHolder::newLabelEntry(this_00,(LabelEntry **)allocator);
  if (EVar2 != 0) {
    return EVar2;
  }
  uVar1 = *(uint *)((long)local_30 + 0xc);
  n = uVar1 + 1;
  if (*(uint *)&this->field_0x190 < n) {
    unaff_R15 = &this->_labelNodes;
    allocator = (BaseBuilder *)&this->_allocator;
    pcStack_40 = (code *)0x116925;
    this_00 = (CodeHolder *)unaff_R15;
    EVar3 = ZoneVectorBase::_resize((ZoneVectorBase *)unaff_R15,(ZoneAllocator *)allocator,8,n);
    if (EVar3 != 0) {
      return EVar3;
    }
    if (uVar1 < *(uint *)&this->field_0x190) {
      *(LabelNode **)(*(long *)&unaff_R15->field_0x0 + (ulong)uVar1 * 8) = node;
      *(uint *)(node + 0x30) = uVar1;
      return 0;
    }
  }
  else {
    pcStack_40 = (code *)0x11695d;
    registerLabelNode();
  }
  pcStack_40 = newAlignNode;
  registerLabelNode();
  (allocator->super_BaseEmitter)._vptr_BaseEmitter = (_func_int **)0x0;
  pLStack_58 = node;
  pBStack_50 = this;
  pZStack_48 = unaff_R15;
  pcStack_40 = (code *)(ulong)EVar2;
  if (*(long *)&this_00->_relocations == 0) {
    newAlignNode();
    EVar2 = extraout_EAX;
  }
  else {
    pLVar4 = (LabelEntry *)
             ZoneAllocator::_alloc((ZoneAllocator *)&this_00->_relocations,0x38,&sStack_60);
    EVar3 = 0;
    node = (LabelNode *)this_00;
    this = allocator;
    EVar2 = 0;
    if (pLVar4 != (LabelEntry *)0x0) {
      *(undefined8 *)pLVar4 = 0;
      *(undefined8 *)&pLVar4->field_0x8 = 0;
      pLVar4->_type = 4;
      pLVar4->_reserved[0] = this_00[1].field_0x58 | 0x11;
      *(undefined8 *)(pLVar4->_reserved + 1) = 0;
      *(undefined8 *)((long)&pLVar4->_offset + 2) = 0;
      pLVar4->_section = (Section *)0x0;
      pLVar4->_links = (LabelLink *)0x0;
      pLVar4->_reserved[1] = extraout_DL;
      *(uint *)&pLVar4->_name = n;
      goto LAB_001169c8;
    }
  }
  EVar3 = EVar2;
  pLVar4 = (LabelEntry *)0x0;
LAB_001169c8:
  (this->super_BaseEmitter)._vptr_BaseEmitter = (_func_int **)pLVar4;
  if (pLVar4 == (LabelEntry *)0x0) {
    EVar3 = BaseEmitter::reportError((BaseEmitter *)node,1,(char *)0x0);
  }
  return EVar3;
}

Assistant:

Error BaseBuilder::registerLabelNode(LabelNode* node) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  LabelEntry* le;
  ASMJIT_PROPAGATE(_code->newLabelEntry(&le));
  uint32_t labelId = le->id();

  // We just added one label so it must be true.
  ASMJIT_ASSERT(_labelNodes.size() < labelId + 1);
  ASMJIT_PROPAGATE(_labelNodes.resize(&_allocator, labelId + 1));

  _labelNodes[labelId] = node;
  node->_labelId = labelId;

  return kErrorOk;
}